

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

void __thiscall CTcDataStream::dec_ofs(CTcDataStream *this,int amount)

{
  ulong uVar1;
  
  uVar1 = this->ofs_ - (long)amount;
  this->ofs_ = uVar1;
  this->page_cur_ = uVar1 / 65000;
  this->rem_ = 65000 - uVar1 % 65000;
  this->wp_ = this->pages_[uVar1 / 65000] + uVar1 % 65000;
  return;
}

Assistant:

void CTcDataStream::dec_ofs(int amount)
{
    /* adjust the offset */
    ofs_ -= amount;

    /* 
     *   calculate the new page we're on, since this may take us to a
     *   different page 
     */
    page_cur_ = ofs_ / TCCS_PAGE_SIZE;

    /* calculate the remaining size in this page */
    rem_ = TCCS_PAGE_SIZE - (ofs_ % TCCS_PAGE_SIZE);

    /* calculate the current write pointer */
    wp_ = calc_addr(ofs_);
}